

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

lzma_ret lzma_strm_init(lzma_stream *strm)

{
  lzma_internal *plVar1;
  undefined1 local_60 [8];
  undefined8 local_58;
  lzma_stream *local_18;
  lzma_stream *strm_local;
  
  if (strm == (lzma_stream *)0x0) {
    strm_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    local_18 = strm;
    if (strm->internal == (lzma_internal *)0x0) {
      plVar1 = (lzma_internal *)lzma_alloc(0x60,strm->allocator);
      local_18->internal = plVar1;
      if (local_18->internal == (lzma_internal *)0x0) {
        return LZMA_MEM_ERROR;
      }
      plVar1 = local_18->internal;
      memset(local_60,0,0x48);
      local_58 = 0xffffffffffffffff;
      memcpy(plVar1,local_60,0x48);
    }
    memset(local_18->internal->supported_actions,0,5);
    local_18->internal->sequence = ISEQ_RUN;
    local_18->internal->allow_buf_error = false;
    local_18->total_in = 0;
    local_18->total_out = 0;
    strm_local._4_4_ = LZMA_OK;
  }
  return strm_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_strm_init(lzma_stream *strm)
{
	if (strm == NULL)
		return LZMA_PROG_ERROR;

	if (strm->internal == NULL) {
		strm->internal = lzma_alloc(sizeof(lzma_internal),
				strm->allocator);
		if (strm->internal == NULL)
			return LZMA_MEM_ERROR;

		strm->internal->next = LZMA_NEXT_CODER_INIT;
	}

	memzero(strm->internal->supported_actions,
			sizeof(strm->internal->supported_actions));
	strm->internal->sequence = ISEQ_RUN;
	strm->internal->allow_buf_error = false;

	strm->total_in = 0;
	strm->total_out = 0;

	return LZMA_OK;
}